

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O3

ParamTestSuiteInfo<RenameParamTest> * __thiscall
iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<RenameParamTest>
          (ParamTestSuiteHolder *this,string *testsuite,string *package)

{
  pointer ppIVar1;
  bool bVar2;
  ParamTestSuiteInfo<RenameParamTest> *this_00;
  pointer ppIVar3;
  ParamTestSuiteInfo<RenameParamTest> *local_30;
  
  ppIVar3 = (this->m_testsuite_infos).
            super__Vector_base<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->m_testsuite_infos).
            super__Vector_base<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar3 == ppIVar1) {
LAB_001168fc:
      this_00 = (ParamTestSuiteInfo<RenameParamTest> *)operator_new(0x88);
      IParamTestSuiteInfo::IParamTestSuiteInfo((IParamTestSuiteInfo *)this_00,testsuite,package);
      (this_00->super_IParamTestSuiteInfo)._vptr_IParamTestSuiteInfo =
           (_func_int **)&PTR__ParamTestSuiteInfo_00135d78;
      (this_00->m_instantiation).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->m_instantiation).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->m_instantiation).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_30 = this_00;
      std::
      vector<iutest::detail::IParamTestSuiteInfo*,std::allocator<iutest::detail::IParamTestSuiteInfo*>>
      ::emplace_back<iutest::detail::IParamTestSuiteInfo*>
                ((vector<iutest::detail::IParamTestSuiteInfo*,std::allocator<iutest::detail::IParamTestSuiteInfo*>>
                  *)this,(IParamTestSuiteInfo **)&local_30);
      return this_00;
    }
    bVar2 = IParamTestSuiteInfo::is_same(*ppIVar3,testsuite,package);
    if (bVar2) {
      if ((ParamTestSuiteInfo<RenameParamTest> *)*ppIVar3 !=
          (ParamTestSuiteInfo<RenameParamTest> *)0x0) {
        return (ParamTestSuiteInfo<RenameParamTest> *)*ppIVar3;
      }
      goto LAB_001168fc;
    }
    ppIVar3 = ppIVar3 + 1;
  } while( true );
}

Assistant:

ParamTestSuiteInfo<T>* GetTestSuitePatternHolder(const ::std::string& testsuite
        , const ::std::string& package IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        ParamTestSuiteInfo<T>* p = static_cast<ParamTestSuiteInfo<T>*>(FindTestSuitePatternHolder(testsuite, package));
        if( p == NULL )
        {
            p = new ParamTestSuiteInfo<T>(testsuite, package);
            m_testsuite_infos.push_back(p);
        }
        return p;
    }